

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O2

int Mvc_CubeCompareIntOutsideMask(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  int i;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  
  uVar1 = *(uint *)&pC1->field_0x8 & 0xffffff;
  if (uVar1 != 0) {
    if (uVar1 == 1) {
      uVar2 = *(uint *)&pC1->field_0x14 | *(uint *)&pMask->field_0x14;
      uVar1 = *(uint *)&pMask->field_0x14 | *(uint *)&pC2->field_0x14;
      if (uVar1 <= uVar2) {
        if (uVar1 < uVar2) {
          return 1;
        }
        uVar2 = pC1->pData[0] | pMask->pData[0];
        uVar1 = pMask->pData[0] | pC2->pData[0];
        bVar4 = uVar2 < uVar1;
        bVar5 = uVar2 == uVar1;
        if (!bVar4) goto LAB_0037d022;
      }
    }
    else {
      while( true ) {
        if ((int)uVar1 < 0) {
          return 0;
        }
        uVar3 = pC1->pData[uVar1] | pMask->pData[uVar1];
        uVar2 = pMask->pData[uVar1] | pC2->pData[uVar1];
        if (uVar3 < uVar2) break;
        uVar1 = uVar1 - 1;
        if (uVar2 < uVar3) {
          return 1;
        }
      }
    }
    return -1;
  }
  uVar2 = pC1->pData[0] | pMask->pData[0];
  uVar1 = pMask->pData[0] | pC2->pData[0];
  bVar4 = uVar2 < uVar1;
  bVar5 = uVar2 == uVar1;
  if (bVar4) {
    return -1;
  }
LAB_0037d022:
  return (int)(!bVar4 && !bVar5);
}

Assistant:

int Mvc_CubeCompareIntOutsideMask( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    unsigned uBits1, uBits2;

    // compare the cubes under the mask
    if ( Mvc_Cube1Words(pC1) )
    {
        uBits1 = pC1->pData[0] | pMask->pData[0];
        uBits2 = pC2->pData[0] | pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        // cubes are equal
        return 0;
    }
    else if ( Mvc_Cube2Words(pC1) )
    {
        uBits1 = pC1->pData[1] | pMask->pData[1];
        uBits2 = pC2->pData[1] | pMask->pData[1];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        uBits1 = pC1->pData[0] | pMask->pData[0];
        uBits2 = pC2->pData[0] | pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        return 0;
    }
    else                            
    {
        int i = Mvc_CubeReadLast(pC1);
        for(; i >= 0; i--)
        {
            uBits1 = pC1->pData[i] | pMask->pData[i];
            uBits2 = pC2->pData[i] | pMask->pData[i];
            if ( uBits1 < uBits2 )
                return -1;
            if ( uBits1 > uBits2 )
                return 1;
        }
        return 0;
    }
}